

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::VECTOR_DIM_DIM_0_Test::TestBody(VECTOR_DIM_DIM_0_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  type v;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  int local_c;
  
  local_c = 1;
  local_30.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>(local_20,"v","1",&local_c,(int *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x10,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VECTOR_DIM, DIM_0) {
        vector_dim<int, 0>::type v = 1;
        EXPECT_EQ(v, 1);
    }